

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvector-generator.cpp
# Opt level: O2

void __thiscall train_context::train_context(train_context *this,int n_embd_,int n_layers_)

{
  long lVar1;
  ggml_context *pgVar2;
  size_t __size;
  void *pvVar3;
  int iVar4;
  ggml_tensor *t;
  vector<unsigned_char,_std::allocator<unsigned_char>_> empty;
  value_type local_68;
  long local_60;
  undefined8 uStack_58;
  undefined1 local_50;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  (this->v_diff_tmp).
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->v_diff_tmp).
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->v_final).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->v_final).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->v_diff).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->v_final).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->v_diff).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->v_diff).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->negative_entries).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->negative_entries).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->v_diff_tmp).
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->positive_entries).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->negative_entries).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->positive_entries).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->positive_entries).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->n_embd = n_embd_;
  this->n_layers = n_layers_;
  lVar1 = ggml_tensor_overhead();
  local_60 = lVar1 * ((long)this->n_layers + -1) * 2;
  uStack_58 = 0;
  local_50 = 1;
  pgVar2 = (ggml_context *)ggml_init();
  this->ctx_ggml = pgVar2;
  for (iVar4 = 0; iVar4 < this->n_layers + -1; iVar4 = iVar4 + 1) {
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::push_back(&this->v_diff_tmp,(value_type *)&local_48);
    local_68 = (value_type)ggml_new_tensor_1d(this->ctx_ggml,0,(long)this->n_embd);
    __size = ggml_nbytes(local_68);
    pvVar3 = malloc(__size);
    local_68->data = pvVar3;
    std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::push_back(&this->v_final,&local_68);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  }
  return;
}

Assistant:

train_context(int n_embd_, int n_layers_) {
        n_embd = n_embd_;
        n_layers = n_layers_;
        struct ggml_init_params params_ggml = {
            /*.mem_size   =*/ ggml_tensor_overhead() * (n_layers - 1) * 2u,
            /*.mem_buffer =*/ NULL,
            /*.no_alloc   =*/ true,
        };
        ctx_ggml = ggml_init(params_ggml);
        for (int il = 0; il < n_layers - 1; il++) {
            std::vector<uint8_t> empty;
            v_diff_tmp.push_back(empty);
            auto t = ggml_new_tensor_1d(ctx_ggml, GGML_TYPE_F32, n_embd);
            t->data = malloc(ggml_nbytes(t)); // TODO: get rid of malloc if possible
            v_final.push_back(t);
        }
    }